

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.hpp
# Opt level: O2

bool __thiscall ProtocolBase::isValid(ProtocolBase *this,uint8_t *buf,size_t n)

{
  uint8_t uVar1;
  uint8_t uVar2;
  char *pcVar3;
  ostream *poVar4;
  
  pcVar3 = "WARNING::ProtcolWrite::Frame header not suitable";
  if ((*buf == 0x90) && (buf[1] == 0xeb)) {
    if ((ulong)buf[3] + 5 == n) {
      uVar1 = buf[n - 1];
      uVar2 = getChecksum(this,buf + 2,n - 3);
      if (uVar1 == uVar2) {
        return true;
      }
      pcVar3 = "WARNING::ProtocolWrite::Checksum is not suitable";
    }
    else {
      pcVar3 = "WARNING::ProtocolWrite::Frame length is not suitable";
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  return false;
}

Assistant:

bool isValid(uint8_t *buf, size_t n) {
        if ((buf[0] != HEADER_RET_1) || (buf[1] != HEADER_RET_2)) {
            std::cout << "WARNING::ProtcolWrite::Frame header not suitable" << std::endl;
            return false;
        }
        if (n != (buf[3] + 5)) {
            std::cout << "WARNING::ProtocolWrite::Frame length is not suitable" << std::endl;
            return false;
        }

        if (buf[n - 1] != getChecksum(&buf[2], n - 3)) {
            std::cout << "WARNING::ProtocolWrite::Checksum is not suitable" << std::endl;
            return false;
        }

        return true;
    }